

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void __thiscall
duckdb::AggregateExecutor::
UnaryScatter<duckdb::IntervalAvgState,duckdb::interval_t,duckdb::IntervalAverageOperation>
          (AggregateExecutor *this,Vector *input,Vector *states,AggregateInputData *aggr_input_data,
          idx_t count)

{
  interval_t *idata;
  IntervalAvgState **states_00;
  UnifiedVectorFormat sdata;
  AggregateUnaryInput input_data;
  SelectionVector *local_b8;
  IntervalAvgState **local_b0;
  interval_t local_70;
  ValidityMask local_60;
  
  if (*this == (AggregateExecutor)0x0) {
    if (*input == (Vector)0x0) {
      idata = *(interval_t **)(this + 0x20);
      states_00 = *(IntervalAvgState ***)(input + 0x20);
      FlatVector::VerifyFlatVector((Vector *)this);
      UnaryFlatLoop<duckdb::IntervalAvgState,duckdb::interval_t,duckdb::IntervalAverageOperation>
                (idata,(AggregateInputData *)states,states_00,(ValidityMask *)(this + 0x28),
                 (idx_t)aggr_input_data);
      return;
    }
  }
  else if ((*this == (AggregateExecutor)0x2) && (*input == (Vector)0x2)) {
    if ((*(byte **)(this + 0x28) != (byte *)0x0) && ((**(byte **)(this + 0x28) & 1) == 0)) {
      return;
    }
    local_70.micros = (int64_t)(this + 0x28);
    local_60.super_TemplatedValidityMask<unsigned_long>.validity_mask = (unsigned_long *)0x0;
    local_70._0_8_ = states;
    BaseSumOperation<duckdb::AverageSetOperation,duckdb::IntervalAdd>::
    ConstantOperation<duckdb::interval_t,duckdb::IntervalAvgState,duckdb::IntervalAverageOperation>
              ((BaseSumOperation<duckdb::AverageSetOperation,duckdb::IntervalAdd> *)
               **(undefined8 **)(input + 0x20),*(IntervalAvgState **)(this + 0x20),&local_70,
               (AggregateUnaryInput *)aggr_input_data,count);
    return;
  }
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_70);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_b8);
  duckdb::Vector::ToUnifiedFormat((ulong)this,(UnifiedVectorFormat *)aggr_input_data);
  duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)aggr_input_data);
  UnaryScatterLoop<duckdb::IntervalAvgState,duckdb::interval_t,duckdb::IntervalAverageOperation>
            ((interval_t *)local_70.micros,(AggregateInputData *)states,local_b0,
             (SelectionVector *)local_70._0_8_,local_b8,&local_60,(idx_t)aggr_input_data);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_b8);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_70);
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}